

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O3

void asio::detail::executor_function::
     complete<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  _func_void_impl_base_ptr_bool *p_Var1;
  _func_void_impl_base_ptr_bool *p_Var2;
  allocator<void> allocator;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> function;
  ptr p;
  allocator<void> local_69;
  impl_base local_68;
  _func_void_impl_base_ptr_bool *p_Stack_60;
  _func_void_impl_base_ptr_bool *local_58;
  _func_void_impl_base_ptr_bool *local_50;
  _func_void_impl_base_ptr_bool *local_48;
  _func_void_impl_base_ptr_bool *p_Stack_40;
  ptr local_30;
  
  local_30.a = &local_69;
  local_68.complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  p_Stack_60 = (_func_void_impl_base_ptr_bool *)0x0;
  local_58 = (_func_void_impl_base_ptr_bool *)0x0;
  p_Var1 = base[4].complete_;
  p_Var2 = base[3].complete_;
  if (p_Var2 != (_func_void_impl_base_ptr_bool *)0x0) {
    local_68.complete_ = base[1].complete_;
    p_Stack_60 = base[2].complete_;
    base[3].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
    base[4].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
    local_58 = p_Var2;
  }
  local_48 = base[5].complete_;
  p_Stack_40 = base[6].complete_;
  local_50 = p_Var1;
  local_30.v = base;
  local_30.p = (impl<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_30);
  if (call) {
    if (p_Var2 == (_func_void_impl_base_ptr_bool *)0x0) {
      std::__throw_bad_function_call();
    }
    (*p_Var1)(&local_68,SUB81(&local_48,0));
    p_Var2 = local_58;
  }
  if (p_Var2 != (_func_void_impl_base_ptr_bool *)0x0) {
    (*p_Var2)(&local_68,SUB81(&local_68,0));
  }
  impl<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_30);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(static_cast<Function&&>(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      static_cast<Function&&>(function)();
    }
  }